

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float16.cpp
# Opt level: O2

uint16_t float2half(float *val)

{
  float fVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  fVar1 = *val;
  uVar4 = (uint)fVar1 & 0x7fffff;
  uVar5 = (uint)fVar1 >> 0x17 & 0xff;
  if ((uVar5 == 0xff) || (iVar6 = (int)(char)((char)((uint)fVar1 >> 0x17) + -0x7f), 0xf < iVar6)) {
    iVar2 = 0x1f;
    if ((uVar5 == 0xff) && (uVar3 = 0x200, uVar4 - 1 < 0x1fff)) goto LAB_0010130b;
  }
  else {
    iVar2 = 0;
    if (-0xf < iVar6) {
      iVar2 = iVar6 + 0xf;
    }
    if (uVar5 == 0) {
      iVar2 = 0;
    }
  }
  uVar3 = 0;
  if (uVar5 != 0) {
    if ((uVar5 == 0xff) || (iVar2 != 0x1f)) {
      if (iVar2 == 0) {
        uVar3 = (ushort)(uVar4 >> 0xf) | 0x100;
        iVar2 = 0;
      }
      else {
        uVar3 = (ushort)(uVar4 >> 0xd);
      }
    }
    else {
      iVar2 = 0x1f;
      uVar3 = 0;
    }
  }
LAB_0010130b:
  return (ushort)(iVar2 << 10) | (ushort)((uint)fVar1 >> 0x10) & 0x8000 | uVar3;
}

Assistant:

static uint16_t float2half(const float& val) {
#ifndef __F16CINTRIN_H
  const uint32_t bits = *reinterpret_cast<const uint32_t*>(&val);

  // Extract the sign from the float value
  const uint16_t sign = (bits & 0x80000000) >> 16;
  // Extract the fraction from the float value
  const uint32_t frac32 = bits & 0x7fffff;
  // Extract the exponent from the float value
  const uint8_t exp32 = (bits & 0x7f800000) >> 23;
  const int8_t exp32_diff = exp32 - 127;

  uint16_t exp16 = 0;
  uint16_t frac16 = frac32 >> 13;

  if (__builtin_expect(exp32 == 0xff || exp32_diff > 15, 0)) {
    exp16 = 0x1f;
  } else if (__builtin_expect(exp32 == 0 || exp32_diff < -14, 0)) {
    exp16 = 0;
  } else {
    exp16 = exp32_diff + 15;
  }

  if (__builtin_expect(exp32 == 0xff && frac32 != 0 && frac16 == 0, 0)) {
    // corner case 1: NaN
    // This case happens when FP32 value is NaN whose the fraction part
    // transformed to FP16 counterpart is truncated to 0. We need to flip the
    // high bit to 1 to make it distinguished from inf.
    frac16 = 0x200;
  } else if (__builtin_expect(exp32 == 0 ||
                              (exp16 == 0x1f && exp32 != 0xff), 0)) {
    // corner case 2: subnormal
    // All FP32 subnormal values are under the range of FP16 so the fraction
    // part is set to 0.
    // corner case 3: overflow
    frac16 = 0;
  } else if (__builtin_expect(exp16 == 0 && exp32 != 0, 0)) {
    // corner case 4: underflow
    // We use `truncate` mode here.
    frac16 = 0x100 | (frac16 >> 2);
  }

  // Compose the final FP16 binary
  uint16_t ret = 0;
  ret |= sign;
  ret |= exp16 << 10;
  ret |= frac16;

  return ret;
#else
  return _cvtss_sh(val, 0);
#endif
}